

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_file.c
# Opt level: O3

int nni_plat_file_put(char *name,void *data,size_t len)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int *piVar5;
  FILE *__s;
  size_t sVar6;
  
  pcVar3 = strchr(name,0x2f);
  if (pcVar3 != (char *)0x0) {
    pcVar3 = nni_strdup(name);
    if (pcVar3 == (char *)0x0) {
      return 2;
    }
    for (pcVar4 = strchr(pcVar3,0x2f); pcVar4 != (char *)0x0; pcVar4 = strchr(pcVar4,0x2f)) {
      if (pcVar4 != pcVar3) {
        *pcVar4 = '\0';
        iVar2 = mkdir(pcVar3,0x1c0);
        *pcVar4 = '/';
        if (iVar2 != 0) {
          piVar5 = __errno_location();
          if (*piVar5 != 0x11) {
            iVar2 = nni_plat_errno(*piVar5);
            nni_strfree(pcVar3);
            if (iVar2 != 0) {
              return iVar2;
            }
            goto LAB_0013abfe;
          }
        }
      }
      pcVar4 = pcVar4 + -1;
      do {
        pcVar1 = pcVar4 + 1;
        pcVar4 = pcVar4 + 1;
      } while (*pcVar1 == '/');
    }
    nni_strfree(pcVar3);
  }
LAB_0013abfe:
  __s = fopen(name,"wb");
  if (__s != (FILE *)0x0) {
    sVar6 = fwrite(data,1,len,__s);
    iVar2 = 0;
    if (sVar6 != len) {
      piVar5 = __errno_location();
      iVar2 = nni_plat_errno(*piVar5);
      unlink(name);
    }
    fclose(__s);
    return iVar2;
  }
  piVar5 = __errno_location();
  iVar2 = nni_plat_errno(*piVar5);
  return iVar2;
}

Assistant:

int
nni_plat_file_put(const char *name, const void *data, size_t len)
{
	FILE *f;
	int   rv = 0;

	// It is possible that the name contains a directory path
	// that does not exist.  In this case we try to create the
	// entire tree.
	if (strchr(name, '/') != NULL) {
		if ((rv = nni_plat_make_parent_dirs(name)) != 0) {
			return (rv);
		}
	}

	if ((f = fopen(name, "wb")) == NULL) {
		return (nni_plat_errno(errno));
	}
	if (fwrite(data, 1, len, f) != len) {
		rv = nni_plat_errno(errno);
		(void) unlink(name);
	}
	(void) fclose(f);
	return (rv);
}